

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

int mspace_trim(mspace msp,size_t pad)

{
  ulong *__addr;
  long lVar1;
  int iVar2;
  size_t sVar3;
  ulong *puVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong __len;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (0xffffffffffffff7f < pad) {
    return 0;
  }
  uVar7 = *(ulong *)((long)msp + 0x28);
  if (uVar7 == 0) {
    return 0;
  }
  if (pad + 0x50 < *(ulong *)((long)msp + 0x10)) {
    __len = ((((*(ulong *)((long)msp + 0x10) - pad) + mparams.granularity) - 0x51) /
             mparams.granularity - 1) * mparams.granularity;
    puVar4 = (ulong *)((long)msp + 0x378);
    puVar9 = puVar4;
    do {
      if ((*puVar9 <= uVar7) && (uVar7 < *puVar9 + puVar9[1])) goto LAB_0010424a;
      puVar9 = (ulong *)puVar9[2];
    } while (puVar9 != (ulong *)0x0);
    puVar9 = (ulong *)0x0;
LAB_0010424a:
    if ((puVar9[3] & 9) == 1) {
      uVar7 = puVar9[1];
      if (__len <= uVar7) {
        __addr = (ulong *)*puVar9;
        do {
          uVar8 = 0;
          if (__addr <= puVar4 && puVar4 < (ulong *)((long)__addr + uVar7)) goto LAB_00104267;
          puVar4 = (ulong *)puVar4[2];
        } while (puVar4 != (ulong *)0x0);
        pvVar5 = mremap(__addr,uVar7,uVar7 - __len,0);
        if (pvVar5 == (void *)0xffffffffffffffff) {
          iVar2 = munmap((void *)((uVar7 - __len) + *puVar9),__len);
          uVar8 = 0;
          if ((__len == 0) || (uVar8 = 0, iVar2 != 0)) goto LAB_00104267;
        }
        else if (__len == 0) goto LAB_00104264;
        puVar9[1] = puVar9[1] - __len;
        *(long *)((long)msp + 0x358) = *(long *)((long)msp + 0x358) - __len;
        lVar1 = *(long *)((long)msp + 0x28);
        lVar6 = *(long *)((long)msp + 0x10) - __len;
        uVar7 = (ulong)(-(int)lVar1 - 0x10U & 0xf);
        uVar8 = lVar6 - uVar7;
        *(ulong *)((long)msp + 0x28) = lVar1 + uVar7;
        *(ulong *)((long)msp + 0x10) = uVar8;
        *(ulong *)(lVar1 + 8 + uVar7) = uVar8 | 1;
        *(undefined8 *)(lVar1 + 8 + lVar6) = 0x50;
        *(size_t *)((long)msp + 0x30) = mparams.trim_threshold;
        uVar8 = __len;
        goto LAB_00104267;
      }
    }
  }
LAB_00104264:
  uVar8 = 0;
LAB_00104267:
  sVar3 = release_unused_segments((mstate)msp);
  iVar2 = 1;
  if (sVar3 + uVar8 == 0) {
    iVar2 = 0;
    if (*(ulong *)((long)msp + 0x30) < *(ulong *)((long)msp + 0x10)) {
      *(undefined8 *)((long)msp + 0x30) = 0xffffffffffffffff;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mspace_trim(mspace msp, size_t pad) {
  int result = 0;
  mstate ms = (mstate)msp;
  if (ok_magic(ms)) {
    if (!PREACTION(ms)) {
      result = sys_trim(ms, pad);
      POSTACTION(ms);
    }
  }
  else {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return result;
}